

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.hpp
# Opt level: O0

ByteArray<6UL> supermap::ByteArray<6UL>::fromString(string *str)

{
  long lVar1;
  IllegalArgumentException *this;
  ulong uVar2;
  char *pcVar3;
  ulong in_RSI;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> in_RDI;
  size_t i;
  ByteArray<6UL> *arr;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  char cVar4;
  char *in_stack_ffffffffffffff78;
  ulong uVar5;
  ulong local_68;
  unsigned_long in_stack_ffffffffffffffa8;
  string local_30 [32];
  ulong local_10;
  
  local_10 = in_RSI;
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 6) {
    ByteArray((ByteArray<6UL> *)0x151c54);
    local_68 = 0;
    while (uVar5 = local_68, uVar2 = std::__cxx11::string::length(), uVar5 < uVar2) {
      pcVar3 = (char *)std::__cxx11::string::operator[](local_10);
      cVar4 = *pcVar3;
      pcVar3 = getCharsPointer((ByteArray<6UL> *)0x151ca3);
      pcVar3[local_68] = cVar4;
      local_68 = local_68 + 1;
    }
    return (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
           (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
           in_RDI._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
           _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  }
  this = (IllegalArgumentException *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(in_stack_ffffffffffffffa8);
  std::operator+(in_stack_ffffffffffffff78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  supermap::IllegalArgumentException::IllegalArgumentException(this,local_30);
  __cxa_throw(this,&IllegalArgumentException::typeinfo,
              IllegalArgumentException::~IllegalArgumentException);
}

Assistant:

static ByteArray<Len> fromString(const std::string &str) {
        if (str.length() != Len) {
            throw IllegalArgumentException(
                "String length can not be different to template size parameter, expected " + std::to_string(Len));
        }
        ByteArray<Len> arr;
        for (std::size_t i = 0; i < str.length(); ++i) {
            arr.getCharsPointer()[i] = str[i];
        }
        return arr;
    }